

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O2

void __thiscall
ExtPrivkey_DerivePubkeyTest_Test::~ExtPrivkey_DerivePubkeyTest_Test
          (ExtPrivkey_DerivePubkeyTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ExtPrivkey, DerivePubkeyTest) {
  std::string ext_base58 = "xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV";
  ExtPrivkey extkey = ExtPrivkey(ext_base58);
  ExtPubkey child;
  ExtPrivkey child1;
  ExtPubkey child2;
  std::vector<uint32_t> path = {0, 0x8000002c};  // 0/44h

  child = extkey.DerivePubkey(path);
  EXPECT_STREQ("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", child.ToString().c_str());
  EXPECT_EQ(extprivkey_kVersionMainnetPubkey, child.GetVersion());

  child1 = extkey.DerivePrivkey(0);
  EXPECT_STREQ("xprvA3hskUkqh1sEWhr726RLmGX7CwQ4jBHtY8ebnDijPhKNTiaCdBCdQe5UfvNFTZXwMm3vGktGpBWKZWCFbhQn5xYdHRPeaLpjCtVHSgoxS6E", child1.ToString().c_str());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, child1.GetVersion());

  child2 = child1.DerivePubkey(0x8000002c);
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());

  child2 = extkey.DerivePubkey("0/44h");
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());

  // KeyData
  KeyData data1 = extkey.DerivePubkeyData("0/44h");
  EXPECT_STREQ("[ae05dbb7/0/44']xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", data1.ToString(false).c_str());
  EXPECT_STREQ("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", data1.GetExtPubkey().ToString().c_str());

  KeyData data2 = extkey.DerivePubkeyData(path);
  EXPECT_STREQ("[ae05dbb7/0/44']xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", data2.ToString(false).c_str());
  EXPECT_STREQ("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", data2.GetExtPubkey().ToString().c_str());
}